

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool ClipperLib::FirstIsBottomPt(OutPt *btmPt1,OutPt *btmPt2)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  bool local_e2;
  bool local_e1;
  double local_a8;
  double dx2n;
  undefined8 local_98;
  cInt local_90;
  cInt local_88;
  double local_80;
  double dx2p;
  undefined8 local_70;
  cInt local_68;
  cInt local_60;
  double local_58;
  double dx1n;
  undefined8 local_48;
  cInt local_40;
  cInt local_38;
  double local_30;
  double dx1p;
  OutPt *p;
  OutPt *btmPt2_local;
  OutPt *btmPt1_local;
  
  dx1p = (double)btmPt1->Prev;
  p = btmPt2;
  btmPt2_local = btmPt1;
  while (bVar1 = operator==((IntPoint *)((long)dx1p + 8),&btmPt2_local->Pt),
        bVar1 && (OutPt *)dx1p != btmPt2_local) {
    dx1p = *(double *)((long)dx1p + 0x20);
  }
  local_40 = (btmPt2_local->Pt).X;
  local_38 = (btmPt2_local->Pt).Y;
  dx1n = (double)((IntPoint *)((long)dx1p + 8))->X;
  local_48 = *(undefined8 *)((long)dx1p + 0x10);
  local_30 = GetDx(btmPt2_local->Pt,*(IntPoint *)((long)dx1p + 8));
  local_30 = ABS(local_30);
  dx1p = (double)btmPt2_local->Next;
  while (bVar1 = operator==((IntPoint *)((long)dx1p + 8),&btmPt2_local->Pt),
        bVar1 && (OutPt *)dx1p != btmPt2_local) {
    dx1p = *(double *)((long)dx1p + 0x18);
  }
  local_68 = (btmPt2_local->Pt).X;
  local_60 = (btmPt2_local->Pt).Y;
  dx2p = (double)((IntPoint *)((long)dx1p + 8))->X;
  local_70 = *(undefined8 *)((long)dx1p + 0x10);
  local_58 = GetDx(btmPt2_local->Pt,*(IntPoint *)((long)dx1p + 8));
  local_58 = ABS(local_58);
  dx1p = (double)p->Prev;
  while (bVar1 = operator==((IntPoint *)((long)dx1p + 8),&p->Pt), bVar1 && (OutPt *)dx1p != p) {
    dx1p = *(double *)((long)dx1p + 0x20);
  }
  local_90 = (p->Pt).X;
  local_88 = (p->Pt).Y;
  dx2n = (double)((IntPoint *)((long)dx1p + 8))->X;
  local_98 = *(undefined8 *)((long)dx1p + 0x10);
  local_80 = GetDx(p->Pt,*(IntPoint *)((long)dx1p + 8));
  local_80 = ABS(local_80);
  dx1p = (double)p->Next;
  while (bVar1 = operator==((IntPoint *)((long)dx1p + 8),&p->Pt), bVar1 && (OutPt *)dx1p != p) {
    dx1p = *(double *)((long)dx1p + 0x18);
  }
  local_a8 = GetDx(p->Pt,*(IntPoint *)((long)dx1p + 8));
  local_a8 = ABS(local_a8);
  pdVar2 = std::max<double>(&local_30,&local_58);
  dVar3 = *pdVar2;
  pdVar2 = std::max<double>(&local_80,&local_a8);
  if ((dVar3 == *pdVar2) && (!NAN(dVar3) && !NAN(*pdVar2))) {
    pdVar2 = std::min<double>(&local_30,&local_58);
    dVar3 = *pdVar2;
    pdVar2 = std::min<double>(&local_80,&local_a8);
    if ((dVar3 == *pdVar2) && (!NAN(dVar3) && !NAN(*pdVar2))) {
      dVar3 = Area(btmPt2_local);
      return 0.0 < dVar3;
    }
  }
  if ((local_30 < local_80) || (local_e1 = true, local_30 < local_a8)) {
    local_e2 = local_80 <= local_58 && local_a8 <= local_58;
    local_e1 = local_e2;
  }
  return local_e1;
}

Assistant:

bool FirstIsBottomPt(const OutPt* btmPt1, const OutPt* btmPt2)
{
  OutPt *p = btmPt1->Prev;
  while ((p->Pt == btmPt1->Pt) && (p != btmPt1)) p = p->Prev;
  double dx1p = std::fabs(GetDx(btmPt1->Pt, p->Pt));
  p = btmPt1->Next;
  while ((p->Pt == btmPt1->Pt) && (p != btmPt1)) p = p->Next;
  double dx1n = std::fabs(GetDx(btmPt1->Pt, p->Pt));

  p = btmPt2->Prev;
  while ((p->Pt == btmPt2->Pt) && (p != btmPt2)) p = p->Prev;
  double dx2p = std::fabs(GetDx(btmPt2->Pt, p->Pt));
  p = btmPt2->Next;
  while ((p->Pt == btmPt2->Pt) && (p != btmPt2)) p = p->Next;
  double dx2n = std::fabs(GetDx(btmPt2->Pt, p->Pt));

  if (std::max(dx1p, dx1n) == std::max(dx2p, dx2n) &&
    std::min(dx1p, dx1n) == std::min(dx2p, dx2n))
      return Area(btmPt1) > 0; //if otherwise identical use orientation
  else
    return (dx1p >= dx2p && dx1p >= dx2n) || (dx1n >= dx2p && dx1n >= dx2n);
}